

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

void __thiscall QMdiArea::closeActiveSubWindow(QMdiArea *this)

{
  long lVar1;
  long lVar2;
  QWidget *this_00;
  int in_ESI;
  
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  lVar2 = *(long *)(lVar1 + 0x388);
  if (((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) &&
     (this_00 = *(QWidget **)(lVar1 + 0x390), this_00 != (QWidget *)0x0)) {
    QWidget::close(this_00,in_ESI);
    return;
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }